

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O3

void __thiscall
jrtplib::RTPSession::BYEDestroy
          (RTPSession *this,RTPTime *maxwaittime,void *reason,size_t reasonlength)

{
  size_t *psVar1;
  RTPMemoryManager *pRVar2;
  RTPTransmitter *pRVar3;
  _List_node_base *p_Var4;
  double dVar5;
  bool bVar6;
  RTCPCompoundPacket *pRVar7;
  bool bVar8;
  int iVar9;
  _List_node_base *p_Var10;
  int *piVar11;
  size_t sVar12;
  _List_node_base *p_Var13;
  RTCPScheduler *this_00;
  RTCPCompoundPacket *pack;
  timespec tpMono;
  timespec tpMono_1;
  RTCPCompoundPacket *local_70;
  timespec local_68;
  timespec local_58;
  RTCPScheduler *local_48;
  _List_node_base *local_40;
  double local_38;
  
  if (this->created == true) {
    if (RTPTime::CurrentTime()::s_initialized == '\0') {
      RTPTime::CurrentTime()::s_initialized = '\x01';
      clock_gettime(0,&local_68);
      clock_gettime(1,&local_58);
      local_38 = (double)local_68.tv_nsec * 1e-09 + (double)local_68.tv_sec;
      RTPTime::CurrentTime()::s_startOffet =
           local_38 - ((double)local_58.tv_nsec * 1e-09 + (double)local_58.tv_sec);
    }
    else {
      clock_gettime(1,&local_68);
      local_38 = (double)local_68.tv_nsec * 1e-09 + (double)local_68.tv_sec +
                 RTPTime::CurrentTime()::s_startOffet;
    }
    local_38 = local_38 + maxwaittime->m_t;
    if (this->sentpackets == true) {
      sVar12 = 0xff;
      if (reasonlength < 0xff) {
        sVar12 = reasonlength;
      }
      iVar9 = RTCPPacketBuilder::BuildBYEPacket
                        (&this->rtcpbuilder,&local_70,reason,sVar12,this->useSR_BYEifpossible);
      if (-1 < iVar9) {
        p_Var10 = (_List_node_base *)operator_new(0x18);
        p_Var10[1]._M_next = (_List_node_base *)local_70;
        std::__detail::_List_node_base::_M_hook(p_Var10);
        sVar12 = (this->byepackets).
                 super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                 ._M_impl._M_node._M_size;
        (this->byepackets).
        super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
        ._M_impl._M_node._M_size = sVar12 + 1;
        if (sVar12 == 0) {
          RTCPScheduler::ScheduleBYEPacket(&this->rtcpsched,local_70->compoundpacketlength);
        }
      }
    }
    p_Var10 = (_List_node_base *)&this->byepackets;
    if ((this->byepackets).
        super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
        ._M_impl._M_node.super__List_node_base._M_next != p_Var10) {
      this_00 = &this->rtcpsched;
      bVar6 = false;
      local_48 = this_00;
      local_40 = p_Var10;
      do {
        if (RTPTime::CurrentTime()::s_initialized == '\0') {
          RTPTime::CurrentTime()::s_initialized = '\x01';
          clock_gettime(0,&local_68);
          clock_gettime(1,&local_58);
          dVar5 = (double)local_68.tv_nsec * 1e-09 + (double)local_68.tv_sec;
          RTPTime::CurrentTime()::s_startOffet =
               dVar5 - ((double)local_58.tv_nsec * 1e-09 + (double)local_58.tv_sec);
        }
        else {
          clock_gettime(1,&local_68);
          dVar5 = (double)local_68.tv_nsec * 1e-09 + (double)local_68.tv_sec +
                  RTPTime::CurrentTime()::s_startOffet;
        }
        if (local_38 <= dVar5) {
          bVar6 = true;
        }
        bVar8 = RTCPScheduler::IsTime(this_00);
        if (bVar8) {
          p_Var10 = (this->byepackets).
                    super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          local_70 = (RTCPCompoundPacket *)p_Var10[1]._M_next;
          psVar1 = &(this->byepackets).
                    super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var10,0x18);
          SendRTCPData(this,local_70->compoundpacket,local_70->compoundpacketlength);
          (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x14])(this,local_70);
          pRVar7 = local_70;
          pRVar2 = (this->super_RTPMemoryObject).mgr;
          if (pRVar2 == (RTPMemoryManager *)0x0) {
            if (local_70 != (RTCPCompoundPacket *)0x0) {
              (*(code *)((_List_node_base *)(local_70->super_RTPMemoryObject)._vptr_RTPMemoryObject)
                        ->_M_prev)(local_70);
            }
          }
          else {
            (*(code *)((_List_node_base *)(local_70->super_RTPMemoryObject)._vptr_RTPMemoryObject)->
                      _M_next)(local_70);
            (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pRVar7);
          }
          p_Var10 = local_40;
          this_00 = local_48;
          p_Var13 = (((_List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                       *)&local_40->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          if (p_Var13 == local_40) break;
          RTCPScheduler::ScheduleBYEPacket(local_48,(size_t)p_Var13[1]._M_next[2]._M_next);
        }
        if (!bVar6) {
          local_68.tv_sec = 0;
          local_68.tv_nsec = 99999999;
          do {
            iVar9 = nanosleep(&local_68,&local_58);
            local_68.tv_sec = local_58.tv_sec;
            local_68.tv_nsec = local_58.tv_nsec;
            if (iVar9 != -1) break;
            piVar11 = __errno_location();
          } while (*piVar11 == 4);
        }
      } while (!bVar6);
    }
    if (this->deletetransmitter == true) {
      pRVar2 = (this->super_RTPMemoryObject).mgr;
      pRVar3 = this->rtptrans;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        if (pRVar3 != (RTPTransmitter *)0x0) {
          (*(pRVar3->super_RTPMemoryObject)._vptr_RTPMemoryObject[1])(pRVar3);
        }
      }
      else {
        (**(pRVar3->super_RTPMemoryObject)._vptr_RTPMemoryObject)(pRVar3);
        (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pRVar3);
      }
    }
    RTPPacketBuilder::Destroy(&this->packetbuilder);
    RTCPPacketBuilder::Destroy(&this->rtcpbuilder);
    RTCPScheduler::Reset(&this->rtcpsched);
    RTPCollisionList::Clear(&this->collisionlist);
    RTPSources::Clear(&(this->sources).super_RTPSources);
    for (p_Var13 = (this->byepackets).
                   super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                   ._M_impl._M_node.super__List_node_base._M_next; p_Var13 != p_Var10;
        p_Var13 = (((_List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                     *)&p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      p_Var4 = p_Var13[1]._M_next;
      pRVar2 = (this->super_RTPMemoryObject).mgr;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        if (p_Var4 != (_List_node_base *)0x0) {
          (**(code **)((long)p_Var4->_M_next + 8))(p_Var4);
        }
      }
      else {
        (**(code **)p_Var4->_M_next)(p_Var4);
        (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,p_Var4);
      }
    }
    std::__cxx11::
    list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::clear
              ((list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                *)p_Var10);
    this->created = false;
  }
  return;
}

Assistant:

void RTPSession::BYEDestroy(const RTPTime &maxwaittime,const void *reason,size_t reasonlength)
{
	if (!created)
		return;

	// first, stop the thread so we have full control over all components
	
#ifdef RTP_SUPPORT_THREAD
	if (pollthread)
		RTPDelete(pollthread,GetMemoryManager());
#endif // RTP_SUPPORT_THREAD

	RTPTime stoptime = RTPTime::CurrentTime();
	stoptime += maxwaittime;

	// add bye packet to the list if we've sent data

	RTCPCompoundPacket *pack;

	if (sentpackets)
	{
		int status;
		
		reasonlength = (reasonlength>RTCP_BYE_MAXREASONLENGTH)?RTCP_BYE_MAXREASONLENGTH:reasonlength;
	       	status = rtcpbuilder.BuildBYEPacket(&pack,reason,reasonlength,useSR_BYEifpossible);
		if (status >= 0)
		{
			byepackets.push_back(pack);
	
			if (byepackets.size() == 1)
				rtcpsched.ScheduleBYEPacket(pack->GetCompoundPacketLength());
		}
	}
	
	if (!byepackets.empty())
	{
		bool done = false;
		
		while (!done)
		{
			RTPTime curtime = RTPTime::CurrentTime();
			
			if (curtime >= stoptime)
				done = true;
		
			if (rtcpsched.IsTime())
			{
				pack = *(byepackets.begin());
				byepackets.pop_front();
			
				SendRTCPData(pack->GetCompoundPacketData(),pack->GetCompoundPacketLength());
				
				OnSendRTCPCompoundPacket(pack); // we'll place this after the actual send to avoid tampering
				
				RTPDelete(pack,GetMemoryManager());
				if (!byepackets.empty()) // more bye packets to send, schedule them
					rtcpsched.ScheduleBYEPacket((*(byepackets.begin()))->GetCompoundPacketLength());
				else
					done = true;
			}
			if (!done)
				RTPTime::Wait(RTPTime(0,100000));
		}
	}
	
	if (deletetransmitter)
		RTPDelete(rtptrans,GetMemoryManager());
	packetbuilder.Destroy();
	rtcpbuilder.Destroy();
	rtcpsched.Reset();
	collisionlist.Clear();
	sources.Clear();

	// clear rest of bye packets
	std::list<RTCPCompoundPacket *>::const_iterator it;

	for (it = byepackets.begin() ; it != byepackets.end() ; it++)
		RTPDelete(*it,GetMemoryManager());
	byepackets.clear();
	
	created = false;
}